

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transform.cpp
# Opt level: O1

Transform * __thiscall sf::Transform::rotate(Transform *this,float angle)

{
  float __x;
  float fVar1;
  Transform rotation;
  Transform local_48;
  
  __x = (angle * 3.1415927) / 180.0;
  fVar1 = cosf(__x);
  local_48.m_matrix[1] = sinf(__x);
  local_48.m_matrix[4] = -local_48.m_matrix[1];
  local_48.m_matrix[0xc] = 0.0;
  local_48.m_matrix[0xd] = 0.0;
  local_48.m_matrix[2] = 0.0;
  local_48.m_matrix[3] = 0.0;
  local_48.m_matrix[6] = 0.0;
  local_48.m_matrix[7] = 0.0;
  local_48.m_matrix[8] = 0.0;
  local_48.m_matrix[9] = 0.0;
  local_48.m_matrix[10] = 1.0;
  local_48.m_matrix[0xb] = 0.0;
  local_48.m_matrix[0xe] = 0.0;
  local_48.m_matrix[0xf] = 1.0;
  local_48.m_matrix[0] = fVar1;
  local_48.m_matrix[5] = fVar1;
  combine(this,&local_48);
  return this;
}

Assistant:

Transform& Transform::rotate(float angle)
{
    float rad = angle * 3.141592654f / 180.f;
    float cos = std::cos(rad);
    float sin = std::sin(rad);

    Transform rotation(cos, -sin, 0,
                       sin,  cos, 0,
                       0,    0,   1);

    return combine(rotation);
}